

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_spirv_c.cpp
# Opt level: O1

dxil_spv_result
dxil_spv_converter_add_option(dxil_spv_converter converter,dxil_spv_option_base *option)

{
  OptionShaderDemoteToHelper *pOVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  dxil_spv_option dVar5;
  dxil_spv_option dVar6;
  undefined8 uVar7;
  dxil_spv_option dVar8;
  bool bVar9;
  dxil_spv_result dVar10;
  OptionShaderDemoteToHelper OVar11;
  OptionShaderDemoteToHelper OVar12;
  OptionShaderDemoteToHelper OVar13;
  OptionShaderDemoteToHelper OVar14;
  OptionShaderDemoteToHelper OVar15;
  OptionShaderDemoteToHelper OVar16;
  OptionShaderDemoteToHelper OVar17;
  OptionShaderDemoteToHelper OVar18;
  OptionShaderDemoteToHelper OVar19;
  OptionShaderDemoteToHelper OVar20;
  OptionShaderDemoteToHelper OVar21;
  OptionShaderDemoteToHelper OVar22;
  OptionShaderDemoteToHelper OVar23;
  OptionShaderDemoteToHelper OVar24;
  OptionShaderDemoteToHelper OVar25;
  OptionShaderDemoteToHelper OVar26;
  OptionShaderDemoteToHelper OVar27;
  OptionShaderDemoteToHelper OVar28;
  OptionShaderDemoteToHelper OVar29;
  OptionShaderDemoteToHelper OVar30;
  OptionShaderDemoteToHelper OVar31;
  OptionShaderDemoteToHelper OVar32;
  OptionShaderDemoteToHelper OVar33;
  _Head_base<0UL,_dxil_spv::OptionShaderDemoteToHelper_*,_false> ptr;
  OptionShaderDemoteToHelper OVar34;
  OptionShaderDemoteToHelper OVar35;
  OptionShaderDemoteToHelper OVar36;
  OptionShaderDemoteToHelper OVar37;
  OptionShaderDemoteToHelper OVar38;
  OptionShaderDemoteToHelper OVar39;
  OptionShaderDemoteToHelper OVar40;
  OptionShaderDemoteToHelper OVar41;
  OptionShaderDemoteToHelper OVar42;
  OptionShaderDemoteToHelper OVar43;
  OptionShaderDemoteToHelper OVar44;
  OptionShaderDemoteToHelper OVar45;
  OptionShaderDemoteToHelper OVar46;
  OptionShaderDemoteToHelper OVar47;
  ulong uVar48;
  OptionShaderDemoteToHelper OVar49;
  OptionShaderSourceFile helper;
  _Head_base<0UL,_dxil_spv::OptionShaderDemoteToHelper_*,_false> local_70;
  undefined1 local_68 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
  local_58;
  OptionShaderDemoteToHelper local_48;
  OptionShaderDemoteToHelper OStack_40;
  OptionShaderSourceFile *local_38;
  
  bVar9 = dxil_spv::Converter::recognizes_option(option->type);
  dVar10 = DXIL_SPV_ERROR_UNSUPPORTED_FEATURE;
  if (!bVar9) {
    return DXIL_SPV_ERROR_UNSUPPORTED_FEATURE;
  }
  switch(option->type) {
  case DXIL_SPV_OPTION_SHADER_DEMOTE_TO_HELPER:
    dVar5 = option[1].type;
    local_70._M_head_impl = (OptionShaderDemoteToHelper *)dxil_spv::allocate_in_thread(8);
    *local_70._M_head_impl =
         (OptionShaderDemoteToHelper)(((ulong)((char)dVar5 != DXIL_SPV_OPTION_INVALID) << 0x20) + 1)
    ;
    std::
    vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
    ::
    emplace_back<std::unique_ptr<dxil_spv::OptionShaderDemoteToHelper,std::default_delete<dxil_spv::OptionShaderDemoteToHelper>>>
              ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                *)&converter->options,
               (unique_ptr<dxil_spv::OptionShaderDemoteToHelper,_std::default_delete<dxil_spv::OptionShaderDemoteToHelper>_>
                *)&local_70);
    break;
  case DXIL_SPV_OPTION_DUAL_SOURCE_BLENDING:
    OVar17.super_OptionBase.type = DualSourceBlending;
    OVar17.supported = true;
    OVar17._5_3_ = 0;
    OVar40.super_OptionBase.type = DualSourceBlending;
    OVar40.supported = false;
    OVar40._5_3_ = 0;
    if ((char)option[1].type != DXIL_SPV_OPTION_INVALID) {
      OVar40 = OVar17;
    }
    local_70._M_head_impl = (OptionShaderDemoteToHelper *)dxil_spv::allocate_in_thread(8);
    *local_70._M_head_impl = OVar40;
    std::
    vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
    ::
    emplace_back<std::unique_ptr<dxil_spv::OptionDualSourceBlending,std::default_delete<dxil_spv::OptionDualSourceBlending>>>
              ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                *)&converter->options,
               (unique_ptr<dxil_spv::OptionDualSourceBlending,_std::default_delete<dxil_spv::OptionDualSourceBlending>_>
                *)&local_70);
    break;
  case DXIL_SPV_OPTION_OUTPUT_SWIZZLE:
    OVar34 = *(OptionShaderDemoteToHelper *)(option + 2);
    dVar5 = option[4].type;
    local_70._M_head_impl = (OptionShaderDemoteToHelper *)dxil_spv::allocate_in_thread(0x18);
    ((local_70._M_head_impl)->super_OptionBase).type = OutputSwizzle;
    local_70._M_head_impl[1] = OVar34;
    local_70._M_head_impl[2].super_OptionBase.type = dVar5;
    std::
    vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
    ::
    emplace_back<std::unique_ptr<dxil_spv::OptionOutputSwizzle,std::default_delete<dxil_spv::OptionOutputSwizzle>>>
              ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                *)&converter->options,
               (unique_ptr<dxil_spv::OptionOutputSwizzle,_std::default_delete<dxil_spv::OptionOutputSwizzle>_>
                *)&local_70);
    break;
  case DXIL_SPV_OPTION_RASTERIZER_SAMPLE_COUNT:
    dVar5 = option[1].type;
    dVar6 = option[2].type;
    local_70._M_head_impl = (OptionShaderDemoteToHelper *)dxil_spv::allocate_in_thread(0xc);
    ((local_70._M_head_impl)->super_OptionBase).type = RasterizerSampleCount;
    *(dxil_spv_option *)&(local_70._M_head_impl)->supported = dVar5;
    *(bool *)&local_70._M_head_impl[1].super_OptionBase.type =
         (char)dVar6 != DXIL_SPV_OPTION_INVALID;
    std::
    vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
    ::
    emplace_back<std::unique_ptr<dxil_spv::OptionRasterizerSampleCount,std::default_delete<dxil_spv::OptionRasterizerSampleCount>>>
              ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                *)&converter->options,
               (unique_ptr<dxil_spv::OptionRasterizerSampleCount,_std::default_delete<dxil_spv::OptionRasterizerSampleCount>_>
                *)&local_70);
    break;
  case DXIL_SPV_OPTION_ROOT_CONSTANT_INLINE_UNIFORM_BLOCK:
    uVar7 = *(undefined8 *)(option + 1);
    dVar5 = option[3].type;
    local_70._M_head_impl = (OptionShaderDemoteToHelper *)dxil_spv::allocate_in_thread(0x10);
    ((local_70._M_head_impl)->super_OptionBase).type = RootConstantInlineUniformBlock;
    *(undefined8 *)&(local_70._M_head_impl)->supported = uVar7;
    local_70._M_head_impl[1].supported = (char)dVar5 == DXIL_SPV_OPTION_SHADER_DEMOTE_TO_HELPER;
    std::
    vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
    ::
    emplace_back<std::unique_ptr<dxil_spv::OptionRootConstantInlineUniformBlock,std::default_delete<dxil_spv::OptionRootConstantInlineUniformBlock>>>
              ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                *)&converter->options,
               (unique_ptr<dxil_spv::OptionRootConstantInlineUniformBlock,_std::default_delete<dxil_spv::OptionRootConstantInlineUniformBlock>_>
                *)&local_70);
    break;
  case DXIL_SPV_OPTION_BINDLESS_CBV_SSBO_EMULATION:
    dVar5 = option[1].type;
    local_70._M_head_impl = (OptionShaderDemoteToHelper *)dxil_spv::allocate_in_thread(8);
    OVar27.super_OptionBase.type = BindlessCBVSSBOEmulation;
    OVar27.supported = true;
    OVar27._5_3_ = 0;
    OVar31.super_OptionBase.type = BindlessCBVSSBOEmulation;
    OVar31.supported = false;
    OVar31._5_3_ = 0;
    if ((char)dVar5 == DXIL_SPV_OPTION_SHADER_DEMOTE_TO_HELPER) {
      OVar31 = OVar27;
    }
    *local_70._M_head_impl = OVar31;
    std::
    vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
    ::
    emplace_back<std::unique_ptr<dxil_spv::OptionBindlessCBVSSBOEmulation,std::default_delete<dxil_spv::OptionBindlessCBVSSBOEmulation>>>
              ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                *)&converter->options,
               (unique_ptr<dxil_spv::OptionBindlessCBVSSBOEmulation,_std::default_delete<dxil_spv::OptionBindlessCBVSSBOEmulation>_>
                *)&local_70);
    break;
  case DXIL_SPV_OPTION_PHYSICAL_STORAGE_BUFFER:
    dVar5 = option[1].type;
    local_70._M_head_impl = (OptionShaderDemoteToHelper *)dxil_spv::allocate_in_thread(8);
    OVar29.super_OptionBase.type = PhysicalStorageBuffer;
    OVar29.supported = true;
    OVar29._5_3_ = 0;
    OVar33.super_OptionBase.type = PhysicalStorageBuffer;
    OVar33.supported = false;
    OVar33._5_3_ = 0;
    if ((char)dVar5 == DXIL_SPV_OPTION_SHADER_DEMOTE_TO_HELPER) {
      OVar33 = OVar29;
    }
    *local_70._M_head_impl = OVar33;
    std::
    vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
    ::
    emplace_back<std::unique_ptr<dxil_spv::OptionPhysicalStorageBuffer,std::default_delete<dxil_spv::OptionPhysicalStorageBuffer>>>
              ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                *)&converter->options,
               (unique_ptr<dxil_spv::OptionPhysicalStorageBuffer,_std::default_delete<dxil_spv::OptionPhysicalStorageBuffer>_>
                *)&local_70);
    break;
  case DXIL_SPV_OPTION_SBT_DESCRIPTOR_SIZE_LOG2:
    uVar7 = *(undefined8 *)(option + 1);
    local_70._M_head_impl = (OptionShaderDemoteToHelper *)dxil_spv::allocate_in_thread(0xc);
    ((local_70._M_head_impl)->super_OptionBase).type = SBTDescriptorSizeLog2;
    *(undefined8 *)&(local_70._M_head_impl)->supported = uVar7;
    std::
    vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
    ::
    emplace_back<std::unique_ptr<dxil_spv::OptionSBTDescriptorSizeLog2,std::default_delete<dxil_spv::OptionSBTDescriptorSizeLog2>>>
              ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                *)&converter->options,
               (unique_ptr<dxil_spv::OptionSBTDescriptorSizeLog2,_std::default_delete<dxil_spv::OptionSBTDescriptorSizeLog2>_>
                *)&local_70);
    break;
  case DXIL_SPV_OPTION_SSBO_ALIGNMENT:
    dVar5 = option[1].type;
    local_70._M_head_impl = (OptionShaderDemoteToHelper *)dxil_spv::allocate_in_thread(8);
    *local_70._M_head_impl = (OptionShaderDemoteToHelper)((ulong)dVar5 << 0x20 | 9);
    std::
    vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
    ::
    emplace_back<std::unique_ptr<dxil_spv::OptionSSBOAlignment,std::default_delete<dxil_spv::OptionSSBOAlignment>>>
              ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                *)&converter->options,
               (unique_ptr<dxil_spv::OptionSSBOAlignment,_std::default_delete<dxil_spv::OptionSSBOAlignment>_>
                *)&local_70);
    break;
  case DXIL_SPV_OPTION_TYPED_UAV_READ_WITHOUT_FORMAT:
    dVar5 = option[1].type;
    local_70._M_head_impl = (OptionShaderDemoteToHelper *)dxil_spv::allocate_in_thread(8);
    *local_70._M_head_impl = (OptionShaderDemoteToHelper)((ulong)(byte)(char)dVar5 << 0x20 | 10);
    std::
    vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
    ::
    emplace_back<std::unique_ptr<dxil_spv::OptionTypedUAVReadWithoutFormat,std::default_delete<dxil_spv::OptionTypedUAVReadWithoutFormat>>>
              ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                *)&converter->options,
               (unique_ptr<dxil_spv::OptionTypedUAVReadWithoutFormat,_std::default_delete<dxil_spv::OptionTypedUAVReadWithoutFormat>_>
                *)&local_70);
    break;
  case DXIL_SPV_OPTION_SHADER_SOURCE_FILE:
    pOVar1 = (OptionShaderDemoteToHelper *)(local_68 + 0x10);
    local_70._M_head_impl._0_4_ = 0xb;
    local_68._8_8_ = 0;
    local_58._M_local_buf[0] = '\0';
    local_68._0_8_ = pOVar1;
    if (*(char **)(option + 2) != (char *)0x0) {
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                  *)local_68,*(char **)(option + 2));
    }
    duplicate<dxil_spv::OptionShaderSourceFile>((OptionShaderSourceFile *)&local_38);
    std::
    vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
    ::
    emplace_back<std::unique_ptr<dxil_spv::OptionShaderSourceFile,std::default_delete<dxil_spv::OptionShaderSourceFile>>>
              ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                *)&converter->options,
               (unique_ptr<dxil_spv::OptionShaderSourceFile,_std::default_delete<dxil_spv::OptionShaderSourceFile>_>
                *)&local_38);
    if (local_38 != (OptionShaderSourceFile *)0x0) {
      std::default_delete<dxil_spv::OptionShaderSourceFile>::operator()
                ((default_delete<dxil_spv::OptionShaderSourceFile> *)&local_38,local_38);
    }
    ptr._M_head_impl = (OptionShaderDemoteToHelper *)local_68._0_8_;
    if ((OptionShaderDemoteToHelper *)local_68._0_8_ != pOVar1) goto LAB_0010d018;
    goto LAB_0010d01d;
  case DXIL_SPV_OPTION_BINDLESS_TYPED_BUFFER_OFFSETS:
    OVar16.super_OptionBase.type = BindlessTypedBufferOffsets;
    OVar16.supported = true;
    OVar16._5_3_ = 0;
    OVar39.super_OptionBase.type = BindlessTypedBufferOffsets;
    OVar39.supported = false;
    OVar39._5_3_ = 0;
    if ((char)option[1].type != DXIL_SPV_OPTION_INVALID) {
      OVar39 = OVar16;
    }
    local_70._M_head_impl = (OptionShaderDemoteToHelper *)dxil_spv::allocate_in_thread(8);
    *local_70._M_head_impl = OVar39;
    std::
    vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
    ::
    emplace_back<std::unique_ptr<dxil_spv::OptionBindlessTypedBufferOffsets,std::default_delete<dxil_spv::OptionBindlessTypedBufferOffsets>>>
              ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                *)&converter->options,
               (unique_ptr<dxil_spv::OptionBindlessTypedBufferOffsets,_std::default_delete<dxil_spv::OptionBindlessTypedBufferOffsets>_>
                *)&local_70);
    break;
  case DXIL_SPV_OPTION_BINDLESS_OFFSET_BUFFER_LAYOUT:
    uVar7 = *(undefined8 *)(option + 1);
    dVar5 = option[3].type;
    local_70._M_head_impl = (OptionShaderDemoteToHelper *)dxil_spv::allocate_in_thread(0x10);
    ((local_70._M_head_impl)->super_OptionBase).type = BindlessOffsetBufferLayout;
    *(undefined8 *)&(local_70._M_head_impl)->supported = uVar7;
    *(dxil_spv_option *)&local_70._M_head_impl[1].supported = dVar5;
    std::
    vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
    ::
    emplace_back<std::unique_ptr<dxil_spv::OptionBindlessOffsetBufferLayout,std::default_delete<dxil_spv::OptionBindlessOffsetBufferLayout>>>
              ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                *)&converter->options,
               (unique_ptr<dxil_spv::OptionBindlessOffsetBufferLayout,_std::default_delete<dxil_spv::OptionBindlessOffsetBufferLayout>_>
                *)&local_70);
    break;
  case DXIL_SPV_OPTION_STORAGE_INPUT_OUTPUT_16BIT:
    dVar5 = option[1].type;
    local_70._M_head_impl = (OptionShaderDemoteToHelper *)dxil_spv::allocate_in_thread(8);
    OVar28.super_OptionBase.type = StorageInputOutput16;
    OVar28.supported = true;
    OVar28._5_3_ = 0;
    OVar32.super_OptionBase.type = StorageInputOutput16;
    OVar32.supported = false;
    OVar32._5_3_ = 0;
    if ((char)dVar5 == DXIL_SPV_OPTION_SHADER_DEMOTE_TO_HELPER) {
      OVar32 = OVar28;
    }
    *local_70._M_head_impl = OVar32;
    std::
    vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
    ::
    emplace_back<std::unique_ptr<dxil_spv::OptionStorageInputOutput16,std::default_delete<dxil_spv::OptionStorageInputOutput16>>>
              ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                *)&converter->options,
               (unique_ptr<dxil_spv::OptionStorageInputOutput16,_std::default_delete<dxil_spv::OptionStorageInputOutput16>_>
                *)&local_70);
    break;
  case DXIL_SPV_OPTION_DESCRIPTOR_QA:
    dVar6 = option[1].type;
    OVar34 = *(OptionShaderDemoteToHelper *)(option + 8);
    dVar5 = option[6].type;
    local_48 = *(OptionShaderDemoteToHelper *)(option + 2);
    OStack_40 = *(OptionShaderDemoteToHelper *)(option + 4);
    local_70._M_head_impl = (OptionShaderDemoteToHelper *)dxil_spv::allocate_in_thread(0x28);
    ((local_70._M_head_impl)->super_OptionBase).type = DescriptorQA;
    (local_70._M_head_impl)->supported = (char)dVar6 == DXIL_SPV_OPTION_SHADER_DEMOTE_TO_HELPER;
    local_70._M_head_impl[1] = local_48;
    local_70._M_head_impl[2] = OStack_40;
    local_70._M_head_impl[3].super_OptionBase.type = dVar5;
    local_70._M_head_impl[4] = OVar34;
    std::
    vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
    ::
    emplace_back<std::unique_ptr<dxil_spv::OptionDescriptorQA,std::default_delete<dxil_spv::OptionDescriptorQA>>>
              ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                *)&converter->options,
               (unique_ptr<dxil_spv::OptionDescriptorQA,_std::default_delete<dxil_spv::OptionDescriptorQA>_>
                *)&local_70);
    break;
  case DXIL_SPV_OPTION_MIN_PRECISION_NATIVE_16BIT:
    dVar5 = option[1].type;
    local_70._M_head_impl = (OptionShaderDemoteToHelper *)dxil_spv::allocate_in_thread(8);
    OVar26.super_OptionBase.type = MinPrecisionNative16Bit;
    OVar26.supported = true;
    OVar26._5_3_ = 0;
    OVar30.super_OptionBase.type = MinPrecisionNative16Bit;
    OVar30.supported = false;
    OVar30._5_3_ = 0;
    if ((char)dVar5 == DXIL_SPV_OPTION_SHADER_DEMOTE_TO_HELPER) {
      OVar30 = OVar26;
    }
    *local_70._M_head_impl = OVar30;
    std::
    vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
    ::
    emplace_back<std::unique_ptr<dxil_spv::OptionMinPrecisionNative16Bit,std::default_delete<dxil_spv::OptionMinPrecisionNative16Bit>>>
              ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                *)&converter->options,
               (unique_ptr<dxil_spv::OptionMinPrecisionNative16Bit,_std::default_delete<dxil_spv::OptionMinPrecisionNative16Bit>_>
                *)&local_70);
    break;
  case DXIL_SPV_OPTION_SHADER_I8_DOT:
    OVar15.super_OptionBase.type = ShaderI8Dot;
    OVar15.supported = true;
    OVar15._5_3_ = 0;
    OVar38.super_OptionBase.type = ShaderI8Dot;
    OVar38.supported = false;
    OVar38._5_3_ = 0;
    if ((char)option[1].type != DXIL_SPV_OPTION_INVALID) {
      OVar38 = OVar15;
    }
    local_70._M_head_impl = (OptionShaderDemoteToHelper *)dxil_spv::allocate_in_thread(8);
    *local_70._M_head_impl = OVar38;
    std::
    vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
    ::
    emplace_back<std::unique_ptr<dxil_spv::OptionShaderI8Dot,std::default_delete<dxil_spv::OptionShaderI8Dot>>>
              ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                *)&converter->options,
               (unique_ptr<dxil_spv::OptionShaderI8Dot,_std::default_delete<dxil_spv::OptionShaderI8Dot>_>
                *)&local_70);
    break;
  case DXIL_SPV_OPTION_SHADER_RAY_TRACING_PRIMITIVE_CULLING:
    OVar19.super_OptionBase.type = ShaderRayTracingPrimitiveCulling;
    OVar19.supported = true;
    OVar19._5_3_ = 0;
    OVar42.super_OptionBase.type = ShaderRayTracingPrimitiveCulling;
    OVar42.supported = false;
    OVar42._5_3_ = 0;
    if ((char)option[1].type != DXIL_SPV_OPTION_INVALID) {
      OVar42 = OVar19;
    }
    local_70._M_head_impl = (OptionShaderDemoteToHelper *)dxil_spv::allocate_in_thread(8);
    *local_70._M_head_impl = OVar42;
    std::
    vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
    ::
    emplace_back<std::unique_ptr<dxil_spv::OptionShaderRayTracingPrimitiveCulling,std::default_delete<dxil_spv::OptionShaderRayTracingPrimitiveCulling>>>
              ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                *)&converter->options,
               (unique_ptr<dxil_spv::OptionShaderRayTracingPrimitiveCulling,_std::default_delete<dxil_spv::OptionShaderRayTracingPrimitiveCulling>_>
                *)&local_70);
    break;
  case DXIL_SPV_OPTION_INVARIANT_POSITION:
    OVar22.super_OptionBase.type = InvariantPosition;
    OVar22.supported = true;
    OVar22._5_3_ = 0;
    OVar45.super_OptionBase.type = InvariantPosition;
    OVar45.supported = false;
    OVar45._5_3_ = 0;
    if ((char)option[1].type != DXIL_SPV_OPTION_INVALID) {
      OVar45 = OVar22;
    }
    local_70._M_head_impl = (OptionShaderDemoteToHelper *)dxil_spv::allocate_in_thread(8);
    *local_70._M_head_impl = OVar45;
    std::
    vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
    ::
    emplace_back<std::unique_ptr<dxil_spv::OptionInvariantPosition,std::default_delete<dxil_spv::OptionInvariantPosition>>>
              ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                *)&converter->options,
               (unique_ptr<dxil_spv::OptionInvariantPosition,_std::default_delete<dxil_spv::OptionInvariantPosition>_>
                *)&local_70);
    break;
  case DXIL_SPV_OPTION_SCALAR_BLOCK_LAYOUT:
    bVar3 = *(byte *)((long)&option[1].type + 1);
    uVar48 = 0x14;
    if ((char)option[1].type != DXIL_SPV_OPTION_INVALID) {
      uVar48 = 0x100000014;
    }
    local_70._M_head_impl = (OptionShaderDemoteToHelper *)dxil_spv::allocate_in_thread(8);
    *local_70._M_head_impl = (OptionShaderDemoteToHelper)((ulong)(bVar3 != 0) << 0x28 | uVar48);
    std::
    vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
    ::
    emplace_back<std::unique_ptr<dxil_spv::OptionScalarBlockLayout,std::default_delete<dxil_spv::OptionScalarBlockLayout>>>
              ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                *)&converter->options,
               (unique_ptr<dxil_spv::OptionScalarBlockLayout,_std::default_delete<dxil_spv::OptionScalarBlockLayout>_>
                *)&local_70);
    break;
  case DXIL_SPV_OPTION_BARYCENTRIC_KHR:
    OVar20.super_OptionBase.type = BarycentricKHR;
    OVar20.supported = true;
    OVar20._5_3_ = 0;
    OVar43.super_OptionBase.type = BarycentricKHR;
    OVar43.supported = false;
    OVar43._5_3_ = 0;
    if ((char)option[1].type != DXIL_SPV_OPTION_INVALID) {
      OVar43 = OVar20;
    }
    local_70._M_head_impl = (OptionShaderDemoteToHelper *)dxil_spv::allocate_in_thread(8);
    *local_70._M_head_impl = OVar43;
    std::
    vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
    ::
    emplace_back<std::unique_ptr<dxil_spv::OptionBarycentricKHR,std::default_delete<dxil_spv::OptionBarycentricKHR>>>
              ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                *)&converter->options,
               (unique_ptr<dxil_spv::OptionBarycentricKHR,_std::default_delete<dxil_spv::OptionBarycentricKHR>_>
                *)&local_70);
    break;
  case DXIL_SPV_OPTION_ROBUST_PHYSICAL_CBV_LOAD:
    OVar21.super_OptionBase.type = RobustPhysicalCBVLoad;
    OVar21.supported = true;
    OVar21._5_3_ = 0;
    OVar44.super_OptionBase.type = RobustPhysicalCBVLoad;
    OVar44.supported = false;
    OVar44._5_3_ = 0;
    if ((char)option[1].type != DXIL_SPV_OPTION_INVALID) {
      OVar44 = OVar21;
    }
    local_70._M_head_impl = (OptionShaderDemoteToHelper *)dxil_spv::allocate_in_thread(8);
    *local_70._M_head_impl = OVar44;
    std::
    vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
    ::
    emplace_back<std::unique_ptr<dxil_spv::OptionRobustPhysicalCBVLoad,std::default_delete<dxil_spv::OptionRobustPhysicalCBVLoad>>>
              ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                *)&converter->options,
               (unique_ptr<dxil_spv::OptionRobustPhysicalCBVLoad,_std::default_delete<dxil_spv::OptionRobustPhysicalCBVLoad>_>
                *)&local_70);
    break;
  case DXIL_SPV_OPTION_ARITHMETIC_RELAXED_PRECISION:
    OVar23.super_OptionBase.type = ArithmeticRelaxedPrecision;
    OVar23.supported = true;
    OVar23._5_3_ = 0;
    OVar46.super_OptionBase.type = ArithmeticRelaxedPrecision;
    OVar46.supported = false;
    OVar46._5_3_ = 0;
    if ((char)option[1].type != DXIL_SPV_OPTION_INVALID) {
      OVar46 = OVar23;
    }
    local_70._M_head_impl = (OptionShaderDemoteToHelper *)dxil_spv::allocate_in_thread(8);
    *local_70._M_head_impl = OVar46;
    std::
    vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
    ::
    emplace_back<std::unique_ptr<dxil_spv::OptionArithmeticRelaxedPrecision,std::default_delete<dxil_spv::OptionArithmeticRelaxedPrecision>>>
              ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                *)&converter->options,
               (unique_ptr<dxil_spv::OptionArithmeticRelaxedPrecision,_std::default_delete<dxil_spv::OptionArithmeticRelaxedPrecision>_>
                *)&local_70);
    break;
  case DXIL_SPV_OPTION_PHYSICAL_ADDRESS_DESCRIPTOR_INDEXING:
    uVar7 = *(undefined8 *)(option + 1);
    local_70._M_head_impl = (OptionShaderDemoteToHelper *)dxil_spv::allocate_in_thread(0xc);
    ((local_70._M_head_impl)->super_OptionBase).type = PhysicalAddressDescriptorIndexing;
    *(undefined8 *)&(local_70._M_head_impl)->supported = uVar7;
    std::
    vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
    ::
    emplace_back<std::unique_ptr<dxil_spv::OptionPhysicalAddressDescriptorIndexing,std::default_delete<dxil_spv::OptionPhysicalAddressDescriptorIndexing>>>
              ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                *)&converter->options,
               (unique_ptr<dxil_spv::OptionPhysicalAddressDescriptorIndexing,_std::default_delete<dxil_spv::OptionPhysicalAddressDescriptorIndexing>_>
                *)&local_70);
    break;
  case DXIL_SPV_OPTION_FORCE_SUBGROUP_SIZE:
    dVar5 = option[1].type;
    dVar6 = option[2].type;
    local_70._M_head_impl = (OptionShaderDemoteToHelper *)dxil_spv::allocate_in_thread(0xc);
    ((local_70._M_head_impl)->super_OptionBase).type = ForceSubgroupSize;
    *(dxil_spv_option *)&(local_70._M_head_impl)->supported = dVar5;
    *(bool *)&local_70._M_head_impl[1].super_OptionBase.type =
         (char)dVar6 != DXIL_SPV_OPTION_INVALID;
    std::
    vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
    ::
    emplace_back<std::unique_ptr<dxil_spv::OptionForceSubgroupSize,std::default_delete<dxil_spv::OptionForceSubgroupSize>>>
              ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                *)&converter->options,
               (unique_ptr<dxil_spv::OptionForceSubgroupSize,_std::default_delete<dxil_spv::OptionForceSubgroupSize>_>
                *)&local_70);
    break;
  case DXIL_SPV_OPTION_DENORM_PRESERVE_SUPPORT:
    bVar3 = *(byte *)((long)&option[1].type + 1);
    uVar48 = 0x1a;
    if ((char)option[1].type != DXIL_SPV_OPTION_INVALID) {
      uVar48 = 0x10000001a;
    }
    local_70._M_head_impl = (OptionShaderDemoteToHelper *)dxil_spv::allocate_in_thread(8);
    *local_70._M_head_impl = (OptionShaderDemoteToHelper)((ulong)(bVar3 != 0) << 0x28 | uVar48);
    std::
    vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
    ::
    emplace_back<std::unique_ptr<dxil_spv::OptionDenormPreserveSupport,std::default_delete<dxil_spv::OptionDenormPreserveSupport>>>
              ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                *)&converter->options,
               (unique_ptr<dxil_spv::OptionDenormPreserveSupport,_std::default_delete<dxil_spv::OptionDenormPreserveSupport>_>
                *)&local_70);
    break;
  case DXIL_SPV_OPTION_STRICT_HELPER_LANE_WAVE_OPS:
    OVar25.super_OptionBase.type = StrictHelperLaneWaveOps;
    OVar25.supported = true;
    OVar25._5_3_ = 0;
    OVar49.super_OptionBase.type = StrictHelperLaneWaveOps;
    OVar49.supported = false;
    OVar49._5_3_ = 0;
    if ((char)option[1].type != DXIL_SPV_OPTION_INVALID) {
      OVar49 = OVar25;
    }
    local_70._M_head_impl = (OptionShaderDemoteToHelper *)dxil_spv::allocate_in_thread(8);
    *local_70._M_head_impl = OVar49;
    std::
    vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
    ::
    emplace_back<std::unique_ptr<dxil_spv::OptionStrictHelperLaneWaveOps,std::default_delete<dxil_spv::OptionStrictHelperLaneWaveOps>>>
              ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                *)&converter->options,
               (unique_ptr<dxil_spv::OptionStrictHelperLaneWaveOps,_std::default_delete<dxil_spv::OptionStrictHelperLaneWaveOps>_>
                *)&local_70);
    break;
  case DXIL_SPV_OPTION_SUBGROUP_PARTITIONED_NV:
    OVar13.super_OptionBase.type = SubgroupPartitionedNV;
    OVar13.supported = true;
    OVar13._5_3_ = 0;
    OVar36.super_OptionBase.type = SubgroupPartitionedNV;
    OVar36.supported = false;
    OVar36._5_3_ = 0;
    if ((char)option[1].type != DXIL_SPV_OPTION_INVALID) {
      OVar36 = OVar13;
    }
    local_70._M_head_impl = (OptionShaderDemoteToHelper *)dxil_spv::allocate_in_thread(8);
    *local_70._M_head_impl = OVar36;
    std::
    vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
    ::
    emplace_back<std::unique_ptr<dxil_spv::OptionSubgroupPartitionedNV,std::default_delete<dxil_spv::OptionSubgroupPartitionedNV>>>
              ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                *)&converter->options,
               (unique_ptr<dxil_spv::OptionSubgroupPartitionedNV,_std::default_delete<dxil_spv::OptionSubgroupPartitionedNV>_>
                *)&local_70);
    break;
  case DXIL_SPV_OPTION_DEAD_CODE_ELIMINATE:
    OVar24.super_OptionBase.type = DeadCodeEliminate;
    OVar24.supported = true;
    OVar24._5_3_ = 0;
    OVar47.super_OptionBase.type = DeadCodeEliminate;
    OVar47.supported = false;
    OVar47._5_3_ = 0;
    if ((char)option[1].type != DXIL_SPV_OPTION_INVALID) {
      OVar47 = OVar24;
    }
    local_70._M_head_impl = (OptionShaderDemoteToHelper *)dxil_spv::allocate_in_thread(8);
    *local_70._M_head_impl = OVar47;
    std::
    vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
    ::
    emplace_back<std::unique_ptr<dxil_spv::OptionDeadCodeEliminate,std::default_delete<dxil_spv::OptionDeadCodeEliminate>>>
              ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                *)&converter->options,
               (unique_ptr<dxil_spv::OptionDeadCodeEliminate,_std::default_delete<dxil_spv::OptionDeadCodeEliminate>_>
                *)&local_70);
    break;
  case DXIL_SPV_OPTION_PRECISE_CONTROL:
    bVar3 = *(byte *)((long)&option[1].type + 1);
    uVar48 = 0x1e;
    if ((char)option[1].type != DXIL_SPV_OPTION_INVALID) {
      uVar48 = 0x10000001e;
    }
    local_70._M_head_impl = (OptionShaderDemoteToHelper *)dxil_spv::allocate_in_thread(8);
    *local_70._M_head_impl = (OptionShaderDemoteToHelper)((ulong)(bVar3 != 0) << 0x28 | uVar48);
    std::
    vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
    ::
    emplace_back<std::unique_ptr<dxil_spv::OptionPreciseControl,std::default_delete<dxil_spv::OptionPreciseControl>>>
              ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                *)&converter->options,
               (unique_ptr<dxil_spv::OptionPreciseControl,_std::default_delete<dxil_spv::OptionPreciseControl>_>
                *)&local_70);
    break;
  case DXIL_SPV_OPTION_SAMPLE_GRAD_OPTIMIZATION_CONTROL:
    bVar3 = *(byte *)((long)&option[1].type + 1);
    uVar48 = 0x1f;
    if ((char)option[1].type != DXIL_SPV_OPTION_INVALID) {
      uVar48 = 0x10000001f;
    }
    local_70._M_head_impl = (OptionShaderDemoteToHelper *)dxil_spv::allocate_in_thread(8);
    *local_70._M_head_impl = (OptionShaderDemoteToHelper)((ulong)(bVar3 != 0) << 0x28 | uVar48);
    std::
    vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
    ::
    emplace_back<std::unique_ptr<dxil_spv::OptionSampleGradOptimizationControl,std::default_delete<dxil_spv::OptionSampleGradOptimizationControl>>>
              ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                *)&converter->options,
               (unique_ptr<dxil_spv::OptionSampleGradOptimizationControl,_std::default_delete<dxil_spv::OptionSampleGradOptimizationControl>_>
                *)&local_70);
    break;
  case DXIL_SPV_OPTION_OPACITY_MICROMAP:
    OVar18.super_OptionBase.type = OpacityMicromap;
    OVar18.supported = true;
    OVar18._5_3_ = 0;
    OVar41.super_OptionBase.type = OpacityMicromap;
    OVar41.supported = false;
    OVar41._5_3_ = 0;
    if ((char)option[1].type != DXIL_SPV_OPTION_INVALID) {
      OVar41 = OVar18;
    }
    local_70._M_head_impl = (OptionShaderDemoteToHelper *)dxil_spv::allocate_in_thread(8);
    *local_70._M_head_impl = OVar41;
    std::
    vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
    ::
    emplace_back<std::unique_ptr<dxil_spv::OptionOpacityMicromap,std::default_delete<dxil_spv::OptionOpacityMicromap>>>
              ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                *)&converter->options,
               (unique_ptr<dxil_spv::OptionOpacityMicromap,_std::default_delete<dxil_spv::OptionOpacityMicromap>_>
                *)&local_70);
    break;
  case DXIL_SPV_OPTION_BRANCH_CONTROL:
    dVar5 = option[1].type;
    dVar6 = option[2].type;
    bVar3 = *(byte *)((long)&option[1].type + 2);
    bVar4 = *(byte *)((long)&option[1].type + 1);
    bVar2 = *(byte *)((long)&option[1].type + 3);
    local_70._M_head_impl = (OptionShaderDemoteToHelper *)dxil_spv::allocate_in_thread(0xc);
    (local_70._M_head_impl)->supported = (char)dVar5 != DXIL_SPV_OPTION_INVALID;
    (local_70._M_head_impl)->field_0x5 = bVar4 != 0;
    (local_70._M_head_impl)->field_0x6 = bVar3 != 0;
    (local_70._M_head_impl)->field_0x7 = bVar2 != 0;
    ((local_70._M_head_impl)->super_OptionBase).type = BranchControl;
    *(bool *)&local_70._M_head_impl[1].super_OptionBase.type =
         (char)dVar6 != DXIL_SPV_OPTION_INVALID;
    std::
    vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
    ::
    emplace_back<std::unique_ptr<dxil_spv::OptionBranchControl,std::default_delete<dxil_spv::OptionBranchControl>>>
              ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                *)&converter->options,
               (unique_ptr<dxil_spv::OptionBranchControl,_std::default_delete<dxil_spv::OptionBranchControl>_>
                *)&local_70);
    break;
  case DXIL_SPV_OPTION_SUBGROUP_PROPERTIES:
    uVar7 = *(undefined8 *)(option + 1);
    local_70._M_head_impl = (OptionShaderDemoteToHelper *)dxil_spv::allocate_in_thread(0xc);
    ((local_70._M_head_impl)->super_OptionBase).type = SubgroupProperties;
    *(undefined8 *)&(local_70._M_head_impl)->supported = uVar7;
    std::
    vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
    ::
    emplace_back<std::unique_ptr<dxil_spv::OptionSubgroupProperties,std::default_delete<dxil_spv::OptionSubgroupProperties>>>
              ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                *)&converter->options,
               (unique_ptr<dxil_spv::OptionSubgroupProperties,_std::default_delete<dxil_spv::OptionSubgroupProperties>_>
                *)&local_70);
    break;
  case DXIL_SPV_OPTION_DESCRIPTOR_HEAP_ROBUSTNESS:
    OVar14.super_OptionBase.type = DescriptorHeapRobustness;
    OVar14.supported = true;
    OVar14._5_3_ = 0;
    OVar37.super_OptionBase.type = DescriptorHeapRobustness;
    OVar37.supported = false;
    OVar37._5_3_ = 0;
    if ((char)option[1].type != DXIL_SPV_OPTION_INVALID) {
      OVar37 = OVar14;
    }
    local_70._M_head_impl = (OptionShaderDemoteToHelper *)dxil_spv::allocate_in_thread(8);
    *local_70._M_head_impl = OVar37;
    std::
    vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
    ::
    emplace_back<std::unique_ptr<dxil_spv::OptionDescriptorHeapRobustness,std::default_delete<dxil_spv::OptionDescriptorHeapRobustness>>>
              ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                *)&converter->options,
               (unique_ptr<dxil_spv::OptionDescriptorHeapRobustness,_std::default_delete<dxil_spv::OptionDescriptorHeapRobustness>_>
                *)&local_70);
    break;
  case DXIL_SPV_OPTION_COMPUTE_SHADER_DERIVATIVES_NV:
    OVar12.super_OptionBase.type = ComputeShaderDerivativesNV;
    OVar12.supported = true;
    OVar12._5_3_ = 0;
    OVar35.super_OptionBase.type = ComputeShaderDerivativesNV;
    OVar35.supported = false;
    OVar35._5_3_ = 0;
    if ((char)option[1].type != DXIL_SPV_OPTION_INVALID) {
      OVar35 = OVar12;
    }
    local_70._M_head_impl = (OptionShaderDemoteToHelper *)dxil_spv::allocate_in_thread(8);
    *local_70._M_head_impl = OVar35;
    std::
    vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
    ::
    emplace_back<std::unique_ptr<dxil_spv::OptionComputeShaderDerivativesNV,std::default_delete<dxil_spv::OptionComputeShaderDerivativesNV>>>
              ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                *)&converter->options,
               (unique_ptr<dxil_spv::OptionComputeShaderDerivativesNV,_std::default_delete<dxil_spv::OptionComputeShaderDerivativesNV>_>
                *)&local_70);
    break;
  case DXIL_SPV_OPTION_QUAD_CONTROL_RECONVERGENCE:
    bVar3 = *(byte *)((long)&option[1].type + 1);
    bVar4 = *(byte *)((long)&option[1].type + 2);
    uVar48 = 0x25;
    if ((char)option[1].type != DXIL_SPV_OPTION_INVALID) {
      uVar48 = 0x100000025;
    }
    local_70._M_head_impl = (OptionShaderDemoteToHelper *)dxil_spv::allocate_in_thread(8);
    *local_70._M_head_impl =
         (OptionShaderDemoteToHelper)
         ((ulong)(bVar3 != 0) << 0x28 | uVar48 | (ulong)(bVar4 != 0) << 0x30);
    std::
    vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
    ::
    emplace_back<std::unique_ptr<dxil_spv::OptionQuadControlReconvergence,std::default_delete<dxil_spv::OptionQuadControlReconvergence>>>
              ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                *)&converter->options,
               (unique_ptr<dxil_spv::OptionQuadControlReconvergence,_std::default_delete<dxil_spv::OptionQuadControlReconvergence>_>
                *)&local_70);
    break;
  case DXIL_SPV_OPTION_RAW_ACCESS_CHAINS_NV:
    OVar11.super_OptionBase.type = RawAccessChainsNV;
    OVar11.supported = true;
    OVar11._5_3_ = 0;
    OVar34.super_OptionBase.type = RawAccessChainsNV;
    OVar34.supported = false;
    OVar34._5_3_ = 0;
    if ((char)option[1].type != DXIL_SPV_OPTION_INVALID) {
      OVar34 = OVar11;
    }
    local_70._M_head_impl = (OptionShaderDemoteToHelper *)dxil_spv::allocate_in_thread(8);
    *local_70._M_head_impl = OVar34;
    std::
    vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
    ::
    emplace_back<std::unique_ptr<dxil_spv::OptionRawAccessChainsNV,std::default_delete<dxil_spv::OptionRawAccessChainsNV>>>
              ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                *)&converter->options,
               (unique_ptr<dxil_spv::OptionRawAccessChainsNV,_std::default_delete<dxil_spv::OptionRawAccessChainsNV>_>
                *)&local_70);
    break;
  case DXIL_SPV_OPTION_DRIVER_VERSION:
    uVar7 = *(undefined8 *)(option + 1);
    local_70._M_head_impl = (OptionShaderDemoteToHelper *)dxil_spv::allocate_in_thread(0xc);
    ((local_70._M_head_impl)->super_OptionBase).type = DriverVersion;
    *(undefined8 *)&(local_70._M_head_impl)->supported = uVar7;
    std::
    vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
    ::
    emplace_back<std::unique_ptr<dxil_spv::OptionDriverVersion,std::default_delete<dxil_spv::OptionDriverVersion>>>
              ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                *)&converter->options,
               (unique_ptr<dxil_spv::OptionDriverVersion,_std::default_delete<dxil_spv::OptionDriverVersion>_>
                *)&local_70);
    break;
  case DXIL_SPV_OPTION_COMPUTE_SHADER_DERIVATIVES:
    bVar3 = *(byte *)((long)&option[1].type + 1);
    uVar48 = 0x28;
    if ((char)option[1].type != DXIL_SPV_OPTION_INVALID) {
      uVar48 = 0x100000028;
    }
    local_70._M_head_impl = (OptionShaderDemoteToHelper *)dxil_spv::allocate_in_thread(8);
    *local_70._M_head_impl = (OptionShaderDemoteToHelper)((ulong)(bVar3 != 0) << 0x28 | uVar48);
    std::
    vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
    ::
    emplace_back<std::unique_ptr<dxil_spv::OptionComputeShaderDerivatives,std::default_delete<dxil_spv::OptionComputeShaderDerivatives>>>
              ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                *)&converter->options,
               (unique_ptr<dxil_spv::OptionComputeShaderDerivatives,_std::default_delete<dxil_spv::OptionComputeShaderDerivatives>_>
                *)&local_70);
    break;
  case DXIL_SPV_OPTION_INSTRUCTION_INSTRUMENTATION:
    dVar8 = option[1].type;
    local_48 = *(OptionShaderDemoteToHelper *)(option + 2);
    OStack_40 = *(OptionShaderDemoteToHelper *)(option + 4);
    dVar5 = option[6].type;
    OVar34 = *(OptionShaderDemoteToHelper *)(option + 8);
    dVar6 = option[10].type;
    local_70._M_head_impl = (OptionShaderDemoteToHelper *)dxil_spv::allocate_in_thread(0x30);
    ((local_70._M_head_impl)->super_OptionBase).type = InstructionInstrumentation;
    (local_70._M_head_impl)->supported = (char)dVar8 != DXIL_SPV_OPTION_INVALID;
    local_70._M_head_impl[1] = local_48;
    local_70._M_head_impl[2] = OStack_40;
    local_70._M_head_impl[3].super_OptionBase.type = dVar5;
    local_70._M_head_impl[4] = OVar34;
    local_70._M_head_impl[5].super_OptionBase.type = dVar6;
    std::
    vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
    ::
    emplace_back<std::unique_ptr<dxil_spv::OptionInstructionInstrumentation,std::default_delete<dxil_spv::OptionInstructionInstrumentation>>>
              ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                *)&converter->options,
               (unique_ptr<dxil_spv::OptionInstructionInstrumentation,_std::default_delete<dxil_spv::OptionInstructionInstrumentation>_>
                *)&local_70);
    break;
  case DXIL_SPV_OPTION_SHADER_QUIRK:
    dVar5 = option[1].type;
    local_70._M_head_impl = (OptionShaderDemoteToHelper *)dxil_spv::allocate_in_thread(8);
    *local_70._M_head_impl = (OptionShaderDemoteToHelper)((ulong)dVar5 << 0x20 | 0x2a);
    std::
    vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
    ::
    emplace_back<std::unique_ptr<dxil_spv::OptionShaderQuirk,std::default_delete<dxil_spv::OptionShaderQuirk>>>
              ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                *)&converter->options,
               (unique_ptr<dxil_spv::OptionShaderQuirk,_std::default_delete<dxil_spv::OptionShaderQuirk>_>
                *)&local_70);
    break;
  case DXIL_SPV_OPTION_EXTENDED_ROBUSTNESS:
    bVar3 = *(byte *)((long)&option[1].type + 1);
    bVar4 = *(byte *)((long)&option[1].type + 2);
    uVar48 = 0x2b;
    if ((char)option[1].type != DXIL_SPV_OPTION_INVALID) {
      uVar48 = 0x10000002b;
    }
    local_70._M_head_impl = (OptionShaderDemoteToHelper *)dxil_spv::allocate_in_thread(8);
    *local_70._M_head_impl =
         (OptionShaderDemoteToHelper)
         ((ulong)(bVar3 != 0) << 0x28 | uVar48 | (ulong)(bVar4 != 0) << 0x30);
    std::
    vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
    ::
    emplace_back<std::unique_ptr<dxil_spv::OptionExtendedRobustness,std::default_delete<dxil_spv::OptionExtendedRobustness>>>
              ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                *)&converter->options,
               (unique_ptr<dxil_spv::OptionExtendedRobustness,_std::default_delete<dxil_spv::OptionExtendedRobustness>_>
                *)&local_70);
    break;
  case DXIL_SPV_OPTION_MAX_TESS_FACTOR:
    dVar5 = option[1].type;
    local_70._M_head_impl = (OptionShaderDemoteToHelper *)dxil_spv::allocate_in_thread(8);
    *local_70._M_head_impl = (OptionShaderDemoteToHelper)((ulong)dVar5 << 0x20 | 0x2c);
    std::
    vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
    ::
    emplace_back<std::unique_ptr<dxil_spv::OptionMaxTessFactor,std::default_delete<dxil_spv::OptionMaxTessFactor>>>
              ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                *)&converter->options,
               (unique_ptr<dxil_spv::OptionMaxTessFactor,_std::default_delete<dxil_spv::OptionMaxTessFactor>_>
                *)&local_70);
    break;
  default:
    goto switchD_0010c31e_default;
  }
  ptr._M_head_impl = local_70._M_head_impl;
  if (local_70._M_head_impl != (OptionShaderDemoteToHelper *)0x0) {
LAB_0010d018:
    dxil_spv::free_in_thread(ptr._M_head_impl);
  }
LAB_0010d01d:
  dVar10 = DXIL_SPV_SUCCESS;
switchD_0010c31e_default:
  return dVar10;
}

Assistant:

dxil_spv_result dxil_spv_converter_add_option(dxil_spv_converter converter, const dxil_spv_option_base *option)
{
	if (!dxil_spv_converter_supports_option(option->type))
		return DXIL_SPV_ERROR_UNSUPPORTED_FEATURE;

	switch (option->type)
	{
	case DXIL_SPV_OPTION_SHADER_DEMOTE_TO_HELPER:
	{
		OptionShaderDemoteToHelper helper;
		helper.supported = bool(reinterpret_cast<const dxil_spv_option_shader_demote_to_helper *>(option)->supported);

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_DUAL_SOURCE_BLENDING:
	{
		OptionDualSourceBlending helper;
		helper.enabled = bool(reinterpret_cast<const dxil_spv_option_dual_source_blending *>(option)->enabled);
		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_OUTPUT_SWIZZLE:
	{
		OptionOutputSwizzle helper;
		const auto *input = reinterpret_cast<const dxil_spv_option_output_swizzle *>(option);
		helper.swizzles = input->swizzles;
		helper.swizzle_count = input->swizzle_count;
		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_RASTERIZER_SAMPLE_COUNT:
	{
		OptionRasterizerSampleCount helper;
		const auto *count = reinterpret_cast<const dxil_spv_option_rasterizer_sample_count *>(option);
		helper.count = count->sample_count;
		helper.spec_constant = bool(count->spec_constant);
		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_ROOT_CONSTANT_INLINE_UNIFORM_BLOCK:
	{
		OptionRootConstantInlineUniformBlock helper;
		const auto *ubo = reinterpret_cast<const dxil_spv_option_root_constant_inline_uniform_block *>(option);
		helper.desc_set = ubo->desc_set;
		helper.binding = ubo->binding;
		helper.enable = ubo->enable == DXIL_SPV_TRUE;
		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_BINDLESS_CBV_SSBO_EMULATION:
	{
		OptionBindlessCBVSSBOEmulation helper;
		helper.enable =
		    reinterpret_cast<const dxil_spv_option_bindless_cbv_ssbo_emulation *>(option)->enable == DXIL_SPV_TRUE;
		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_PHYSICAL_STORAGE_BUFFER:
	{
		OptionPhysicalStorageBuffer helper;
		helper.enable =
		    reinterpret_cast<const dxil_spv_option_physical_storage_buffer *>(option)->enable == DXIL_SPV_TRUE;
		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_SBT_DESCRIPTOR_SIZE_LOG2:
	{
		OptionSBTDescriptorSizeLog2 helper;
		helper.size_log2_srv_uav_cbv = reinterpret_cast<const dxil_spv_option_sbt_descriptor_size_log2 *>(option)->size_log2_srv_uav_cbv;
		helper.size_log2_sampler = reinterpret_cast<const dxil_spv_option_sbt_descriptor_size_log2 *>(option)->size_log2_sampler;
		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_SSBO_ALIGNMENT:
	{
		OptionSSBOAlignment helper;
		helper.alignment = reinterpret_cast<const dxil_spv_option_ssbo_alignment *>(option)->alignment;
		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_TYPED_UAV_READ_WITHOUT_FORMAT:
	{
		OptionTypedUAVReadWithoutFormat helper;
		helper.supported = reinterpret_cast<const dxil_spv_option_typed_uav_read_without_format *>(option)->supported == DXIL_SPV_TRUE;
		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_SHADER_SOURCE_FILE:
	{
		OptionShaderSourceFile helper;
		const char *name = reinterpret_cast<const dxil_spv_option_shader_source_file *>(option)->name;
		if (name)
			helper.name = name;
		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_BINDLESS_TYPED_BUFFER_OFFSETS:
	{
		OptionBindlessTypedBufferOffsets helper;
		helper.enable = reinterpret_cast<const dxil_spv_option_bindless_typed_buffer_offsets *>(option)->enable;
		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_BINDLESS_OFFSET_BUFFER_LAYOUT:
	{
		OptionBindlessOffsetBufferLayout helper;
		auto *opt = reinterpret_cast<const dxil_spv_option_bindless_offset_buffer_layout *>(option);
		helper.untyped_offset = opt->untyped_offset;
		helper.typed_offset = opt->typed_offset;
		helper.stride = opt->stride;
		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_STORAGE_INPUT_OUTPUT_16BIT:
	{
		OptionStorageInputOutput16 helper;
		helper.supported =
		    reinterpret_cast<const dxil_spv_option_storage_input_output_16bit *>(option)->supported == DXIL_SPV_TRUE;
		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_DESCRIPTOR_QA:
	{
		OptionDescriptorQA helper;
		auto *qa = reinterpret_cast<const dxil_spv_option_descriptor_qa *>(option);
		helper.enabled = qa->enabled == DXIL_SPV_TRUE;
		helper.shader_hash = qa->shader_hash;
		helper.global_desc_set = qa->global_desc_set;
		helper.global_binding = qa->global_binding;
		helper.heap_desc_set = qa->heap_desc_set;
		helper.heap_binding = qa->heap_binding;
		helper.version = qa->version;
		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_MIN_PRECISION_NATIVE_16BIT:
	{
		OptionMinPrecisionNative16Bit helper;
		auto *minprec = reinterpret_cast<const dxil_spv_option_min_precision_native_16bit *>(option);
		helper.enabled = minprec->enabled == DXIL_SPV_TRUE;
		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_SHADER_I8_DOT:
	{
		OptionShaderI8Dot helper;
		helper.supported = bool(reinterpret_cast<const dxil_spv_option_shader_i8_dot *>(option)->supported);

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_SHADER_RAY_TRACING_PRIMITIVE_CULLING:
	{
		OptionShaderRayTracingPrimitiveCulling helper;
		helper.supported = bool(reinterpret_cast<const dxil_spv_option_shader_ray_tracing_primitive_culling *>(option)->supported);

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_INVARIANT_POSITION:
	{
		OptionInvariantPosition helper;
		helper.enabled = bool(reinterpret_cast<const dxil_spv_option_invariant_position *>(option)->enabled);

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_SCALAR_BLOCK_LAYOUT:
	{
		OptionScalarBlockLayout helper;
		auto *opt = reinterpret_cast<const dxil_spv_option_scalar_block_layout *>(option);
		helper.supported = bool(opt->supported);
		helper.supports_per_component_robustness = bool(opt->supports_per_component_robustness);

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_BARYCENTRIC_KHR:
	{
		OptionBarycentricKHR helper;
		auto *opt = reinterpret_cast<const dxil_spv_option_barycentric_khr *>(option);
		helper.supported = bool(opt->supported);

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_ROBUST_PHYSICAL_CBV_LOAD:
	{
		OptionRobustPhysicalCBVLoad helper;
		auto *robust = reinterpret_cast<const dxil_spv_option_robust_physical_cbv_load *>(option);
		helper.enabled = bool(robust->enabled);

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_ARITHMETIC_RELAXED_PRECISION:
	{
		OptionArithmeticRelaxedPrecision helper;
		auto *robust = reinterpret_cast<const dxil_spv_option_arithmetic_relaxed_precision *>(option);
		helper.enabled = bool(robust->enabled);

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_PHYSICAL_ADDRESS_DESCRIPTOR_INDEXING:
	{
		OptionPhysicalAddressDescriptorIndexing helper;
		auto *indexing = reinterpret_cast<const dxil_spv_option_physical_address_descriptor_indexing *>(option);
		helper.element_stride = indexing->element_stride;
		helper.element_offset = indexing->element_offset;

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_FORCE_SUBGROUP_SIZE:
	{
		OptionForceSubgroupSize helper;
		auto *subgroup = reinterpret_cast<const dxil_spv_option_force_subgroup_size *>(option);
		helper.forced_value = subgroup->forced_value;
		helper.wave_size_enable = subgroup->wave_size_enable;

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_DENORM_PRESERVE_SUPPORT:
	{
		OptionDenormPreserveSupport helper;
		auto *denorm = reinterpret_cast<const dxil_spv_option_denorm_preserve_support *>(option);
		helper.support_float16_denorm_preserve = bool(denorm->supports_float16_denorm_preserve);
		helper.support_float64_denorm_preserve = bool(denorm->supports_float64_denorm_preserve);

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_STRICT_HELPER_LANE_WAVE_OPS:
	{
		OptionStrictHelperLaneWaveOps helper;
		auto *strict = reinterpret_cast<const dxil_spv_option_strict_helper_lane_wave_ops *>(option);
		helper.enable = strict->enable;

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_SUBGROUP_PARTITIONED_NV:
	{
		OptionSubgroupPartitionedNV helper;
		auto *partitioned = reinterpret_cast<const dxil_spv_option_subgroup_partitioned_nv *>(option);
		helper.supported = partitioned->supported;

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_DEAD_CODE_ELIMINATE:
	{
		OptionDeadCodeEliminate helper;
		auto *eliminate = reinterpret_cast<const dxil_spv_option_dead_code_eliminate *>(option);
		helper.enabled = eliminate->enabled;

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_PRECISE_CONTROL:
	{
		OptionPreciseControl helper;
		auto *precise = reinterpret_cast<const dxil_spv_option_precise_control *>(option);
		helper.force_precise = precise->force_precise;
		helper.propagate_precise = precise->propagate_precise;

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_SAMPLE_GRAD_OPTIMIZATION_CONTROL:
	{
		OptionSampleGradOptimizationControl helper;
		auto *precise = reinterpret_cast<const dxil_spv_option_sample_grad_optimization_control *>(option);
		helper.enabled = precise->enabled;
		helper.assume_uniform_scale = precise->assume_uniform_scale;

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_OPACITY_MICROMAP:
	{
		OptionOpacityMicromap helper;
		auto *omm = reinterpret_cast<const dxil_spv_option_opacity_micromap *>(option);
		helper.enabled = omm->enabled;

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_BRANCH_CONTROL:
	{
		OptionBranchControl helper;
		auto *branch = reinterpret_cast<const dxil_spv_option_branch_control *>(option);
		helper.use_shader_metadata = branch->use_shader_metadata;
		helper.force_branch = branch->force_branch;
		helper.force_loop = branch->force_loop;
		helper.force_unroll = branch->force_unroll;
		helper.force_flatten = branch->force_flatten;

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_SUBGROUP_PROPERTIES:
	{
		OptionSubgroupProperties helper;
		auto *sub = reinterpret_cast<const dxil_spv_option_subgroup_properties *>(option);
		helper.minimum_size = sub->minimum_size;
		helper.maximum_size = sub->maximum_size;

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_DESCRIPTOR_HEAP_ROBUSTNESS:
	{
		OptionDescriptorHeapRobustness helper;
		auto *rob = reinterpret_cast<const dxil_spv_option_descriptor_heap_robustness *>(option);
		helper.enabled = rob->enabled;

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_COMPUTE_SHADER_DERIVATIVES_NV:
	{
		OptionComputeShaderDerivativesNV helper;
		auto *deriv = reinterpret_cast<const dxil_spv_option_compute_shader_derivatives_nv *>(option);
		helper.supported = deriv->supported;

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_QUAD_CONTROL_RECONVERGENCE:
	{
		OptionQuadControlReconvergence helper;
		auto *quad = reinterpret_cast<const dxil_spv_option_quad_control_reconvergence *>(option);
		helper.supports_quad_control = quad->supports_quad_control;
		helper.supports_maximal_reconvergence = quad->supports_maximal_reconvergence;
		helper.force_maximal_reconvergence = quad->force_maximal_reconvergence;

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_RAW_ACCESS_CHAINS_NV:
	{
		OptionRawAccessChainsNV helper;
		auto *chain = reinterpret_cast<const dxil_spv_option_raw_access_chains_nv *>(option);
		helper.supported = chain->supported;

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_DRIVER_VERSION:
	{
		OptionDriverVersion helper;
		auto *ver = reinterpret_cast<const dxil_spv_option_driver_version *>(option);
		helper.driver_id = ver->driver_id;
		helper.driver_version = ver->driver_version;

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_COMPUTE_SHADER_DERIVATIVES:
	{
		OptionComputeShaderDerivatives helper;
		auto *deriv = reinterpret_cast<const dxil_spv_option_compute_shader_derivatives *>(option);
		helper.supports_nv = deriv->supports_nv;
		helper.supports_khr = deriv->supports_khr;

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_INSTRUCTION_INSTRUMENTATION:
	{
		OptionInstructionInstrumentation helper;
		auto *inst = reinterpret_cast<const dxil_spv_option_instruction_instrumentation *>(option);
		helper.enabled = inst->enabled;
		helper.version = inst->version;
		helper.control_desc_set = inst->control_desc_set;
		helper.control_binding = inst->control_binding;
		helper.payload_desc_set = inst->payload_desc_set;
		helper.payload_binding = inst->payload_binding;
		helper.shader_hash = inst->shader_hash;
		helper.type = InstructionInstrumentationType(inst->type);

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_SHADER_QUIRK:
	{
		OptionShaderQuirk helper;
		auto *quirk = reinterpret_cast<const dxil_spv_option_shader_quirk *>(option);
		helper.quirk = static_cast<ShaderQuirk>(quirk->quirk);

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_EXTENDED_ROBUSTNESS:
	{
		OptionExtendedRobustness helper;
		auto *robust = reinterpret_cast<const dxil_spv_option_extended_robustness *>(option);
		helper.robust_group_shared = robust->robust_group_shared;
		helper.robust_alloca = robust->robust_alloca;
		helper.robust_constant_lut = robust->robust_constant_lut;

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_MAX_TESS_FACTOR:
	{
		OptionMaxTessFactor helper;
		auto *tess_factor = reinterpret_cast<const dxil_spv_option_max_tess_factor *>(option);
		helper.max_tess_factor = tess_factor->max_tess_factor;

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	default:
		return DXIL_SPV_ERROR_UNSUPPORTED_FEATURE;
	}

	return DXIL_SPV_SUCCESS;
}